

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.cc
# Opt level: O1

void __thiscall
leveldb::CacheTest_UseExceedsCacheSize_Test::TestBody(CacheTest_UseExceedsCacheSize_Test *this)

{
  Cache *pCVar1;
  undefined8 *puVar2;
  char *message;
  int key;
  ulong uVar3;
  vector<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_> h;
  AssertionResult gtest_ar;
  Handle **local_68;
  iterator iStack_60;
  Handle **local_58;
  Message local_50;
  Handle *local_48;
  undefined8 *local_40;
  AssertHelper local_38;
  
  local_68 = (Handle **)0x0;
  iStack_60._M_current = (Handle **)0x0;
  local_58 = (Handle **)0x0;
  key = 1000;
  do {
    local_48 = CacheTest::InsertAndReturnHandle(&this->super_CacheTest,key,key + 1000,1);
    if (iStack_60._M_current == local_58) {
      std::vector<leveldb::Cache::Handle*,std::allocator<leveldb::Cache::Handle*>>::
      _M_realloc_insert<leveldb::Cache::Handle*>
                ((vector<leveldb::Cache::Handle*,std::allocator<leveldb::Cache::Handle*>> *)
                 &local_68,iStack_60,&local_48);
    }
    else {
      *iStack_60._M_current = local_48;
      iStack_60._M_current = iStack_60._M_current + 1;
    }
    key = key + 1;
  } while (key != 0x834);
  if (iStack_60._M_current != local_68) {
    uVar3 = 0;
    do {
      local_50.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = (int)uVar3 + 2000;
      local_38.data_._0_4_ = CacheTest::Lookup(&this->super_CacheTest,(int)uVar3 + 1000);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_48,"2000 + i","Lookup(1000 + i)",(int *)&local_50,
                 (int *)&local_38);
      puVar2 = local_40;
      if (local_48._0_1_ == (internal)0x0) {
        testing::Message::Message(&local_50);
        if (local_40 == (undefined8 *)0x0) {
          message = "";
        }
        else {
          message = (char *)*local_40;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache_test.cc"
                   ,0xa2,message);
        testing::internal::AssertHelper::operator=(&local_38,&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if ((long *)CONCAT44(local_50.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             (int)local_50.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_50.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         (int)local_50.ss_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl) + 8))();
        }
        if (local_40 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_40 != local_40 + 2) {
            operator_delete((undefined8 *)*local_40);
          }
          operator_delete(local_40);
        }
        goto LAB_0010ad40;
      }
      if (local_40 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_40 != local_40 + 2) {
          operator_delete((undefined8 *)*local_40);
        }
        operator_delete(puVar2);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)iStack_60._M_current - (long)local_68 >> 3));
  }
  if (iStack_60._M_current != local_68) {
    uVar3 = 0;
    do {
      pCVar1 = (this->super_CacheTest).cache_;
      (*pCVar1->_vptr_Cache[4])(pCVar1,local_68[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)iStack_60._M_current - (long)local_68 >> 3));
  }
LAB_0010ad40:
  if (local_68 != (Handle **)0x0) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

TEST_F(CacheTest, UseExceedsCacheSize) {
  // Overfill the cache, keeping handles on all inserted entries.
  std::vector<Cache::Handle*> h;
  for (int i = 0; i < kCacheSize + 100; i++) {
    h.push_back(InsertAndReturnHandle(1000 + i, 2000 + i));
  }

  // Check that all the entries can be found in the cache.
  for (int i = 0; i < h.size(); i++) {
    ASSERT_EQ(2000 + i, Lookup(1000 + i));
  }

  for (int i = 0; i < h.size(); i++) {
    cache_->Release(h[i]);
  }
}